

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createShaderProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,string *vtxSource,string *frgSource,
          bool separable)

{
  bool bVar1;
  ShaderProgramWrapper *pSVar2;
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  TestLog *this_01;
  undefined8 extraout_RAX;
  TestError *this_02;
  double __x;
  double __x_00;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper> local_17a;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper> local_179;
  undefined1 local_178 [8];
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
  wrapper;
  ShaderSource local_160;
  ShaderSource local_128;
  undefined1 local_100 [8];
  ProgramSources sources;
  bool separable_local;
  string *frgSource_local;
  string *vtxSource_local;
  SeparateShaderTest *this_local;
  
  sources._207_1_ = separable;
  glu::ProgramSources::ProgramSources((ProgramSources *)local_100);
  if (vtxSource != (string *)0x0) {
    glu::VertexSource::VertexSource((VertexSource *)&local_128,vtxSource);
    glu::ProgramSources::operator<<((ProgramSources *)local_100,&local_128);
    glu::VertexSource::~VertexSource((VertexSource *)&local_128);
  }
  if (frgSource != (string *)0x0) {
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_160,frgSource);
    glu::ProgramSources::operator<<((ProgramSources *)local_100,&local_160);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_160);
  }
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)
             &wrapper.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
              .m_data.field_0xf,(bool)(sources._207_1_ & 1));
  glu::ProgramSources::operator<<
            ((ProgramSources *)local_100,
             (ProgramSeparable *)
             &wrapper.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
              .m_data.field_0xf);
  pSVar2 = (ShaderProgramWrapper *)operator_new(0xd8);
  renderCtx = getRenderContext(this);
  ShaderProgramWrapper::ShaderProgramWrapper(pSVar2,renderCtx,(ProgramSources *)local_100);
  de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>::
  DefaultDeleter(&local_179);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
  ::MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
             *)local_178,pSVar2);
  pSVar2 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
           ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
                         *)local_178);
  this_00 = ShaderProgramWrapper::getShaderProgram(pSVar2);
  bVar1 = glu::ShaderProgram::isOk(this_00);
  if (!bVar1) {
    log(this,__x);
    tcu::TestLog::writeMessage(this_01,"Couldn\'t create shader program");
    pSVar2 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
                           *)local_178);
    log(this,__x_00);
    (*(pSVar2->super_ProgramWrapper)._vptr_ProgramWrapper[3])(pSVar2,extraout_RAX);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Couldn\'t create shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
               ,0x454);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar2 = de::details::
           MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
           ::release((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
                      *)local_178);
  de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>::
  DefaultDeleter(&local_17a);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(__return_storage_ptr__,pSVar2);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ShaderProgramWrapper>_>
              *)local_178);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_100);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createShaderProgram (const string*	vtxSource,
																 const string*	frgSource,
																 bool			separable)
{
	ProgramSources sources;

	if (vtxSource != DE_NULL)
		sources << VertexSource(*vtxSource);
	if (frgSource != DE_NULL)
		sources << FragmentSource(*frgSource);
	sources << ProgramSeparable(separable);

	MovePtr<ShaderProgramWrapper> wrapper (new ShaderProgramWrapper(getRenderContext(),
																	sources));
	if (!wrapper->getShaderProgram().isOk())
	{
		log().writeMessage("Couldn't create shader program");
		wrapper->writeToLog(log());
		TCU_FAIL("Couldn't create shader program");
	}

	return MovePtr<ProgramWrapper>(wrapper.release());
}